

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionDiscrete.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
JointActionDiscrete::ConstructIndividualActionDiscretesIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          JointActionDiscrete *this)

{
  pointer ppAVar1;
  undefined8 in_RAX;
  pointer ppAVar2;
  Index index;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppAVar1 = (this->_m_apVector).
            super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uStack_28 = in_RAX;
  for (ppAVar2 = (this->_m_apVector).
                 super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppAVar2 != ppAVar1;
      ppAVar2 = ppAVar2 + 1) {
    uStack_28 = CONCAT44(((*ppAVar2)->super_DiscreteEntity)._m_index,(undefined4)uStack_28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,(value_type_conflict1 *)((long)&uStack_28 + 4));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Index> JointActionDiscrete::ConstructIndividualActionDiscretesIndices() const
{
    vector<Index> iv;
    vector<const ActionDiscrete*>::const_iterator it = _m_apVector.begin();
    vector<const ActionDiscrete*>::const_iterator last = _m_apVector.end();
    while(it != last)
    {
        
        Index index = (*it)->GetIndex();
        iv.push_back( index );
        it++;
    }
    return(iv);
}